

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

void Acb_Ntk4DumpWeights(char *pFileNameIn,Vec_Ptr_t *vObjNames,char *pFileName)

{
  char *__s2;
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  Acb_Ntk_t *p_00;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  char *__s1;
  int iVar5;
  ulong uVar6;
  size_t __size;
  long lVar7;
  
  iVar1 = vObjNames->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  p->nSize = 0;
  p->nCap = iVar5;
  if (iVar5 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar5 << 2);
  }
  p->pArray = piVar2;
  p_00 = Acb_VerilogSimpleRead(pFileNameIn,(char *)0x0);
  iVar1 = (p_00->vObjType).nCap;
  if ((p_00->vFanouts).nCap < iVar1) {
    pVVar3 = (p_00->vFanouts).pArray;
    __size = (long)iVar1 << 4;
    if (pVVar3 == (Vec_Int_t *)0x0) {
      pVVar3 = (Vec_Int_t *)malloc(__size);
    }
    else {
      pVVar3 = (Vec_Int_t *)realloc(pVVar3,__size);
    }
    (p_00->vFanouts).pArray = pVVar3;
    lVar7 = (long)(p_00->vFanouts).nCap;
    memset(pVVar3 + lVar7,0,(iVar1 - lVar7) * 0x10);
    (p_00->vFanouts).nCap = iVar1;
  }
  (p_00->vFanouts).nSize = iVar1;
  if (1 < (p_00->vObjType).nSize) {
    lVar7 = 1;
    do {
      if ((p_00->vObjType).nSize <= lVar7) {
LAB_003b1197:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p_00->vObjType).pArray[lVar7] != '\0') {
        Acb_ObjAddFaninFanout(p_00,(int)lVar7);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p_00->vObjType).nSize);
  }
  if (0 < vObjNames->nSize) {
    lVar7 = 0;
    do {
      if (1 < (p_00->vObjType).nSize) {
        __s2 = (char *)vObjNames->pArray[lVar7];
        uVar6 = 1;
        do {
          if ((long)(p_00->vObjType).nSize <= (long)uVar6) goto LAB_003b1197;
          if ((p_00->vObjType).pArray[uVar6] != '\0') {
            uVar4 = (ulong)(p_00->vObjName).nSize;
            if ((long)uVar4 < 1) {
              __assert_fail("Acb_NtkHasObjNames(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                            ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
            }
            if (uVar4 <= uVar6) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            __s1 = Abc_NamStr(p_00->pDesign->pStrs,(p_00->vObjName).pArray[uVar6]);
            iVar1 = strcmp(__s1,__s2);
            if (iVar1 == 0) {
              Vec_IntPush(p,(int)uVar6);
            }
          }
          uVar6 = uVar6 + 1;
        } while ((long)uVar6 < (long)(p_00->vObjType).nSize);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vObjNames->nSize);
  }
  Acb_Ntk4DumpWeightsInt(p_00,p,pFileName);
  Acb_ManFree(p_00->pDesign);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Acb_Ntk4DumpWeights( char * pFileNameIn, Vec_Ptr_t * vObjNames, char * pFileName )
{
    char * pName; int i, iObj;
    Vec_Int_t * vObjs = Vec_IntAlloc( Vec_PtrSize(vObjNames) );
    Acb_Ntk_t * pNtkF = Acb_VerilogSimpleRead( pFileNameIn, NULL );
    Acb_NtkCreateFanout( pNtkF );
    Vec_PtrForEachEntry( char *, vObjNames, pName, i )
    {
        Acb_NtkForEachObj( pNtkF, iObj )
            if ( !strcmp(Acb_ObjNameStr(pNtkF, iObj), pName) )
                Vec_IntPush( vObjs, iObj );
    }
    Acb_Ntk4DumpWeightsInt( pNtkF, vObjs, pFileName );
    Acb_ManFree( pNtkF->pDesign );
    Vec_IntFree( vObjs );
}